

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O0

bool __thiscall clickhouse::TypeParser::Parse(TypeParser *this,TypeAst *type)

{
  string_view name;
  Meta MVar1;
  Code CVar2;
  reference ppTVar3;
  reference pvVar4;
  size_type sVar5;
  undefined8 in_RSI;
  long in_RDI;
  Token *token;
  value_type *in_stack_fffffffffffffdd8;
  TypeAst *in_stack_fffffffffffffde0;
  TypeAst *in_stack_fffffffffffffde8;
  vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *in_stack_fffffffffffffdf0;
  TypeParser *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> local_1a8;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  size_t in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  TypeParser local_138;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [48];
  undefined4 local_38 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  *(undefined8 *)(in_RDI + 0x10) = in_RSI;
  std::
  stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
  ::push((stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
          *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  do {
    NextToken(in_stack_fffffffffffffe00);
    local_30.field_2._M_allocated_capacity = (size_type)local_38;
    switch(local_38[0]) {
    case 0:
      return false;
    case 1:
    case 7:
      in_stack_fffffffffffffde0 = (TypeAst *)(in_RDI + 0x18);
      ppTVar3 = std::
                stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
                ::top((stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
                       *)0x23cae9);
      *(value_type *)(in_RDI + 0x10) = *ppTVar3;
      std::
      stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
      ::pop((stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
             *)0x23cb02);
      in_stack_fffffffffffffde8 = (TypeAst *)(*(long *)(in_RDI + 0x10) + 0x50);
      in_stack_fffffffffffffe98 = (char *)0x0;
      local_178 = 0;
      in_stack_fffffffffffffe90 = 0;
      local_188 = 0;
      uStack_180 = 0;
      local_1a8.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uStack_190 = 0;
      local_1a8.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      in_stack_fffffffffffffdf0 = &local_1a8;
      TypeAst::TypeAst(in_stack_fffffffffffffde0);
      std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::
      emplace_back<clickhouse::TypeAst>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      TypeAst::~TypeAst(in_stack_fffffffffffffde0);
      std::
      stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
      ::push((stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
              *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      pvVar4 = std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::back
                         ((vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *)
                          in_stack_fffffffffffffde0);
      *(reference *)(in_RDI + 0x10) = pvVar4;
      break;
    case 2:
      name._M_str = in_stack_fffffffffffffe98;
      name._M_len = in_stack_fffffffffffffe90;
      MVar1 = GetTypeMeta(name);
      **(Meta **)(in_RDI + 0x10) = MVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::__cxx11::string::operator=((string *)(*(long *)(in_RDI + 0x10) + 8),local_68);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator(&local_69);
      CVar2 = GetTypeCode((string *)in_stack_fffffffffffffde8);
      *(Code *)(*(long *)(in_RDI + 0x10) + 4) = CVar2;
      break;
    case 3:
      **(undefined4 **)(in_RDI + 0x10) = 4;
      in_stack_fffffffffffffe20 = &local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe18 =
           (basic_string_view<char,_std::char_traits<char>_> *)
           std::__cxx11::stol((string *)in_stack_fffffffffffffde0,
                              (size_t *)in_stack_fffffffffffffdd8,0);
      *(basic_string_view<char,_std::char_traits<char>_> **)(*(long *)(in_RDI + 0x10) + 0x28) =
           in_stack_fffffffffffffe18;
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator(&local_a1);
      break;
    case 4:
      **(undefined4 **)(in_RDI + 0x10) = 5;
      in_stack_fffffffffffffe10 = &local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::__cxx11::string::operator=((string *)(*(long *)(in_RDI + 0x10) + 0x30),local_c8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator(&local_c9);
      break;
    case 5:
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_map_size = 0;
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_138.type_ = (TypeAst *)0x0;
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_138.cur_ = (char *)0x0;
      local_138.end_ = (char *)0x0;
      local_138.open_elements_.c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      in_stack_fffffffffffffe00 = &local_138;
      TypeAst::TypeAst(in_stack_fffffffffffffde0);
      std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::
      emplace_back<clickhouse::TypeAst>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      TypeAst::~TypeAst(in_stack_fffffffffffffde0);
      std::
      stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
      ::push((stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
              *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      pvVar4 = std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::back
                         ((vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_> *)
                          in_stack_fffffffffffffde0);
      *(reference *)(in_RDI + 0x10) = pvVar4;
      break;
    case 6:
      ppTVar3 = std::
                stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
                ::top((stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
                       *)0x23cabc);
      *(value_type *)(in_RDI + 0x10) = *ppTVar3;
      std::
      stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
      ::pop((stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
             *)0x23cad1);
      break;
    case 8:
      sVar5 = std::
              stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
              ::size((stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
                      *)0x23cbe9);
      if (sVar5 != 1) {
        return false;
      }
      return true;
    }
  } while( true );
}

Assistant:

bool TypeParser::Parse(TypeAst* type) {
    type_ = type;
    open_elements_.push(type_);

    do {
        const Token& token = NextToken();

        switch (token.type) {
            case Token::Name:
                type_->meta = GetTypeMeta(token.value);
                type_->name = std::string(token.value);
                type_->code = GetTypeCode(type_->name);
                break;
            case Token::Number:
                type_->meta = TypeAst::Number;
                type_->value = std::stol(std::string(token.value));
                break;
            case Token::String:
                type_->meta = TypeAst::String;
                type_->value_string = std::string(token.value);
                break;
            case Token::LPar:
                type_->elements.emplace_back(TypeAst());
                open_elements_.push(type_);
                type_ = &type_->elements.back();
                break;
            case Token::RPar:
                type_ = open_elements_.top();
                open_elements_.pop();
                break;
            case Token::Assign:
            case Token::Comma:
                type_ = open_elements_.top();
                open_elements_.pop();
                type_->elements.emplace_back(TypeAst());
                open_elements_.push(type_);
                type_ = &type_->elements.back();
                break;
            case Token::EOS:
                // Ubalanced braces, brackets, etc is an error.
                if (open_elements_.size() != 1) {
                    return false;
                }
                return true;
            case Token::Invalid:
                return false;
        }
    } while (true);
}